

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

int buildMap(TIFFRGBAImage *img)

{
  ushort *puVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  undefined1 auVar6 [16];
  uint16_t *r;
  TIFFRGBValue *pTVar7;
  uint32_t **ppuVar8;
  undefined1 (*pauVar9) [16];
  char *pcVar10;
  byte bVar11;
  sbyte sVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint16_t *g;
  ulong uVar16;
  char *fmt;
  uint uVar17;
  uint32_t **ppuVar18;
  sbyte sVar19;
  uint16_t *b;
  tmsize_t s;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  uint32_t **ppuVar26;
  TIFF *pTVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  undefined1 auVar31 [14];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long local_58;
  long local_50;
  undefined1 (*local_48) [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  uVar2 = img->photometric;
  if (6 < uVar2) {
    return 1;
  }
  if ((100U >> (uVar2 & 0x1f) & 1) == 0) {
    if ((3U >> (uVar2 & 0x1f) & 1) == 0) {
      if (uVar2 != 3) {
        return 1;
      }
      puVar3 = img->redcmap;
      puVar4 = img->greencmap;
      puVar5 = img->bluecmap;
      bVar11 = (byte)img->bitspersample;
      lVar20 = 1L << (bVar11 & 0x3f);
      lVar21 = 0;
      do {
        if (lVar20 < 1) {
          pTVar27 = img->tif;
          pcVar10 = TIFFFileName(pTVar27);
          TIFFWarningExtR(pTVar27,pcVar10,"Assuming 8-bit colormap");
          goto LAB_002a0723;
        }
        if ((0xff < *(ushort *)((long)puVar3 + lVar21)) ||
           (0xff < *(ushort *)((long)puVar4 + lVar21))) break;
        lVar20 = lVar20 + -1;
        puVar1 = (ushort *)((long)puVar5 + lVar21);
        lVar21 = lVar21 + 2;
      } while (*puVar1 < 0x100);
      lVar21 = -(-1L << (bVar11 & 0x3f));
      do {
        puVar3[lVar21 + -1] = (ushort)*(byte *)((long)puVar3 + lVar21 * 2 + -1);
        puVar4[lVar21 + -1] = (ushort)*(byte *)((long)puVar4 + lVar21 * 2 + -1);
        puVar5[lVar21 + -1] = (ushort)*(byte *)((long)puVar5 + lVar21 * 2 + -1);
        lVar21 = lVar21 + -1;
      } while (0 < lVar21);
LAB_002a0723:
      uVar2 = img->bitspersample;
      uVar22 = (ulong)uVar2;
      if (8 < uVar2) {
        return 1;
      }
      puVar3 = img->redcmap;
      puVar4 = img->greencmap;
      puVar5 = img->bluecmap;
      ppuVar8 = (uint32_t **)
                _TIFFmallocExt(img->tif,(ulong)(byte)(8 / (uVar2 & 0xff)) * 0x400 + 0x800);
      img->PALmap = ppuVar8;
      auVar6 = _DAT_0032fbc0;
      if (ppuVar8 != (uint32_t **)0x0) {
        pauVar9 = (undefined1 (*) [16])(ppuVar8 + 0x100);
        uVar16 = 0;
        do {
          img->PALmap[uVar16] = (uint32_t *)pauVar9;
          lVar21 = 8;
          uVar25 = uVar22;
          switch(uVar2) {
          case 1:
            uVar25 = uVar16 >> 7 & 0x1ffffff;
            uVar15 = (ulong)((uint)(uVar16 >> 5) & 2);
            uVar29 = (ulong)((uint)(uVar16 >> 4) & 2);
            uVar23 = (ulong)((uint)(uVar16 >> 3) & 2);
            auVar31._2_2_ = *(undefined2 *)((long)puVar3 + uVar15);
            auVar31._0_2_ = puVar3[uVar25];
            auVar31._4_2_ = *(undefined2 *)((long)puVar3 + uVar29);
            auVar31._6_2_ = *(undefined2 *)((long)puVar3 + uVar23);
            local_48 = pauVar9 + 1;
            auVar31._8_6_ = 0;
            auVar32._2_2_ = *(undefined2 *)((long)puVar4 + uVar15);
            auVar32._0_2_ = puVar4[uVar25];
            auVar32._4_2_ = *(undefined2 *)((long)puVar4 + uVar29);
            auVar32._6_2_ = *(undefined2 *)((long)puVar4 + uVar23);
            auVar32._8_8_ = 0;
            auVar32 = psllw(auVar32,8);
            auVar31 = auVar32._0_14_ | auVar31 & SUB1614(ZEXT816(0xff00ff00ff00ff),0);
            auVar36._0_12_ = auVar31._0_12_;
            auVar36._12_2_ = auVar31._6_2_;
            auVar36._14_2_ = *(undefined2 *)((long)puVar5 + uVar23);
            auVar35._12_4_ = auVar36._12_4_;
            auVar35._0_10_ = auVar31._0_10_;
            auVar35._10_2_ = *(undefined2 *)((long)puVar5 + uVar29);
            auVar34._10_6_ = auVar35._10_6_;
            auVar34._0_8_ = auVar31._0_8_;
            auVar34._8_2_ = auVar31._4_2_;
            auVar33._8_8_ = auVar34._8_8_;
            auVar33._6_2_ = *(undefined2 *)((long)puVar5 + uVar15);
            auVar33._4_2_ = auVar31._2_2_;
            auVar33._0_2_ = auVar31._0_2_;
            auVar33._2_2_ = puVar5[uVar25];
            *pauVar9 = auVar33 | auVar6;
            local_50 = 0x20;
            uVar29 = 0x1c;
            lVar21 = 0x18;
            sVar19 = 2;
            local_58 = 0x14;
            uVar17 = 1;
            sVar12 = 3;
            uVar28 = 1;
            uVar25 = 1;
            break;
          case 2:
            local_50 = 0x10;
            uVar29 = 0xc;
            uVar28 = 3;
            local_58 = 4;
            uVar17 = 0x3ffffff;
            sVar12 = 6;
            sVar19 = 4;
            local_48 = pauVar9;
            break;
          default:
            goto switchD_002a07b2_caseD_3;
          case 4:
            uVar28 = 0xfffffff;
            pauVar24 = pauVar9;
            local_50 = lVar21;
            uVar29 = uVar22;
            uVar17 = 0xf;
            goto LAB_002a096e;
          case 8:
            local_50 = 4;
            uVar25 = uVar16;
            pauVar30 = pauVar9;
            goto LAB_002a09b7;
          }
          uVar15 = (ulong)((uVar17 & (uint)(uVar16 >> sVar12)) * 2);
          *(uint *)*local_48 =
               (uint)*(ushort *)((long)puVar5 + uVar15) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar15) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar15) | 0xff000000;
          uVar15 = (ulong)((uVar28 & (uint)(uVar16 >> sVar19)) * 2);
          *(uint *)((long)*pauVar9 + local_58) =
               (uint)*(ushort *)((long)puVar5 + uVar15) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar15) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar15) | 0xff000000;
          pauVar24 = (undefined1 (*) [16])((long)*pauVar9 + lVar21);
          uVar17 = uVar28;
LAB_002a096e:
          uVar25 = (ulong)((uVar28 & (uint)(uVar16 >> ((byte)uVar25 & 0x3f))) * 2);
          pauVar30 = (undefined1 (*) [16])((long)*pauVar9 + uVar29);
          *(uint *)*pauVar24 =
               (uint)*(ushort *)((long)puVar5 + uVar25) << 0x10 |
               (*(ushort *)((long)puVar4 + uVar25) & 0xff) << 8 |
               (uint)*(byte *)((long)puVar3 + uVar25) | 0xff000000;
          uVar25 = (ulong)(uVar17 & (uint)uVar16);
LAB_002a09b7:
          pauVar9 = (undefined1 (*) [16])((long)*pauVar9 + local_50);
          *(uint *)*pauVar30 =
               (uint)puVar5[uVar25] << 0x10 |
               (puVar4[uVar25] & 0xff) << 8 | (uint)(byte)puVar3[uVar25] | 0xff000000;
switchD_002a07b2_caseD_3:
          uVar16 = uVar16 + 1;
          if (uVar16 == 0x100) {
            return 1;
          }
        } while( true );
      }
      pTVar27 = img->tif;
      pcVar10 = TIFFFileName(pTVar27);
      fmt = "No space for Palette mapping table";
      goto LAB_002a0463;
    }
  }
  else if (img->bitspersample == 8) {
    return 1;
  }
  uVar17 = 0xff;
  if (img->bitspersample != 0x10) {
    uVar17 = ~(uint)(-1L << ((byte)img->bitspersample & 0x3f));
  }
  uVar28 = uVar17 + 1;
  pTVar7 = (TIFFRGBValue *)_TIFFmallocExt(img->tif,(long)(int)uVar28);
  img->Map = pTVar7;
  if (pTVar7 == (TIFFRGBValue *)0x0) {
    pTVar27 = img->tif;
    pcVar10 = TIFFFileName(pTVar27);
    fmt = "No space for photometric conversion table";
  }
  else {
    if (img->photometric == 0) {
      if (-1 < (int)uVar17) {
        iVar14 = uVar17 * 0xff;
        uVar22 = 0;
        do {
          img->Map[uVar22] = (TIFFRGBValue)(iVar14 / (int)uVar17);
          uVar22 = uVar22 + 1;
          iVar14 = iVar14 + -0xff;
        } while (uVar28 != uVar22);
      }
    }
    else if (-1 < (int)uVar17) {
      uVar13 = 0;
      uVar22 = 0;
      do {
        img->Map[uVar22] = (TIFFRGBValue)(uVar13 / uVar17);
        uVar22 = uVar22 + 1;
        uVar13 = uVar13 + 0xff;
      } while (uVar28 != uVar22);
    }
    uVar2 = img->bitspersample;
    uVar22 = (ulong)uVar2;
    if (0x10 < uVar2) {
      return 1;
    }
    if (1 < img->photometric) {
      return 1;
    }
    pTVar7 = img->Map;
    s = 0xc00;
    if (uVar2 < 9) {
      s = (ulong)(byte)(8 / (uVar2 & 0xff)) * 0x400 + 0x800;
    }
    ppuVar8 = (uint32_t **)_TIFFmallocExt(img->tif,s);
    img->BWmap = ppuVar8;
    if (ppuVar8 != (uint32_t **)0x0) {
      ppuVar8 = ppuVar8 + 0x100;
      uVar16 = 0;
      do {
        img->BWmap[uVar16] = (uint32_t *)ppuVar8;
        lVar21 = 8;
        uVar17 = (uint)uVar16;
        uVar25 = uVar22;
        switch(uVar2) {
        case 1:
          *(uint *)ppuVar8 = (uint)pTVar7[uVar16 >> 7 & 0x1ffffff] * 0x10101 | 0xff000000;
          *(uint *)((long)ppuVar8 + 4) = (uint)pTVar7[(uVar17 >> 6 & 1) != 0] * 0x10101 | 0xff000000
          ;
          *(uint *)(ppuVar8 + 1) = (uint)pTVar7[(uVar17 >> 5 & 1) != 0] * 0x10101 | 0xff000000;
          ppuVar18 = ppuVar8 + 2;
          *(uint *)((long)ppuVar8 + 0xc) =
               (uint)pTVar7[(uVar17 >> 4 & 1) != 0] * 0x10101 | 0xff000000;
          local_50 = 0x20;
          uVar29 = 0x1c;
          lVar21 = 0x18;
          sVar19 = 2;
          local_58 = 0x14;
          uVar28 = 1;
          sVar12 = 3;
          uVar13 = 1;
          uVar25 = 1;
          goto LAB_002a062f;
        case 2:
          local_50 = 0x10;
          uVar29 = 0xc;
          uVar13 = 3;
          local_58 = 4;
          uVar28 = 0x3ffffff;
          sVar12 = 6;
          sVar19 = 4;
          ppuVar18 = ppuVar8;
LAB_002a062f:
          *(uint *)ppuVar18 = (uint)pTVar7[uVar28 & (uint)(uVar16 >> sVar12)] * 0x10101 | 0xff000000
          ;
          ppuVar26 = (uint32_t **)(lVar21 + (long)ppuVar8);
          *(uint *)((long)ppuVar8 + local_58) =
               (uint)pTVar7[uVar13 & (uint)(uVar16 >> sVar19)] * 0x10101 | 0xff000000;
          uVar28 = uVar13;
LAB_002a069c:
          ppuVar18 = (uint32_t **)(uVar29 + (long)ppuVar8);
          *(uint *)ppuVar26 =
               (uint)pTVar7[uVar13 & (uint)(uVar16 >> ((byte)uVar25 & 0x3f))] * 0x10101 | 0xff000000
          ;
          uVar25 = (ulong)(uVar28 & uVar17);
LAB_002a06c5:
          ppuVar8 = (uint32_t **)((long)ppuVar8 + local_50);
          *(uint *)ppuVar18 = (uint)pTVar7[uVar25] * 0x10101 | 0xff000000;
          break;
        case 3:
        case 5:
        case 6:
        case 7:
          break;
        case 4:
          uVar13 = 0xfffffff;
          uVar29 = uVar22;
          ppuVar26 = ppuVar8;
          local_50 = lVar21;
          uVar28 = 0xf;
          goto LAB_002a069c;
        case 8:
switchD_002a0534_caseD_8:
          local_50 = 4;
          ppuVar18 = ppuVar8;
          uVar25 = uVar16;
          goto LAB_002a06c5;
        default:
          if (uVar2 == 0x10) goto switchD_002a0534_caseD_8;
        }
        uVar16 = uVar16 + 1;
        if (uVar16 == 0x100) {
          _TIFFfreeExt(img->tif,img->Map);
          img->Map = (TIFFRGBValue *)0x0;
          return 1;
        }
      } while( true );
    }
    pTVar27 = img->tif;
    pcVar10 = TIFFFileName(pTVar27);
    fmt = "No space for B&W mapping table";
  }
LAB_002a0463:
  TIFFErrorExtR(pTVar27,pcVar10,fmt);
  return 0;
}

Assistant:

static int buildMap(TIFFRGBAImage *img)
{
    switch (img->photometric)
    {
        case PHOTOMETRIC_RGB:
        case PHOTOMETRIC_YCBCR:
        case PHOTOMETRIC_SEPARATED:
            if (img->bitspersample == 8)
                break;
            /* fall through... */
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_MINISWHITE:
            if (!setupMap(img))
                return (0);
            break;
        case PHOTOMETRIC_PALETTE:
            /*
             * Convert 16-bit colormap to 8-bit (unless it looks
             * like an old-style 8-bit colormap).
             */
            if (checkcmap(img) == 16)
                cvtcmap(img);
            else
                TIFFWarningExtR(img->tif, TIFFFileName(img->tif),
                                "Assuming 8-bit colormap");
            /*
             * Use mapping table and colormap to construct
             * unpacking tables for samples < 8 bits.
             */
            if (img->bitspersample <= 8 && !makecmap(img))
                return (0);
            break;
    }
    return (1);
}